

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH32_hash_t XXH32_digest(XXH32_state_t *state)

{
  int iVar1;
  xxh_u32 xVar2;
  int *in_RDI;
  xxh_u32 unaff_retaddr;
  xxh_u32 h32;
  XXH_alignment in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI[1] == 0) {
    iVar1 = in_RDI[4] + 0x165667b1;
  }
  else {
    iVar1 = (in_RDI[2] << 1 | (uint)(in_RDI[2] < 0)) + (in_RDI[3] << 7 | (uint)in_RDI[3] >> 0x19) +
            (in_RDI[4] << 0xc | (uint)in_RDI[4] >> 0x14) +
            (in_RDI[5] << 0x12 | (uint)in_RDI[5] >> 0xe);
  }
  xVar2 = XXH32_finalize(unaff_retaddr,(xxh_u8 *)in_RDI,
                         CONCAT44(*in_RDI + iVar1,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffec);
  return xVar2;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32_digest(const XXH32_state_t* state)
{
    xxh_u32 h32;

    if (state->large_len) {
        h32 = XXH_rotl32(state->v[0], 1)
            + XXH_rotl32(state->v[1], 7)
            + XXH_rotl32(state->v[2], 12)
            + XXH_rotl32(state->v[3], 18);
    } else {
        h32 = state->v[2] /* == seed */ + XXH_PRIME32_5;
    }

    h32 += state->total_len_32;

    return XXH32_finalize(h32, (const xxh_u8*)state->mem32, state->memsize, XXH_aligned);
}